

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

Ptr __thiscall SimpleSyntaxAnalyzer::analyze(SimpleSyntaxAnalyzer *this,TokenReader *tokens)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  SimpleASTNode *pSVar2;
  _Alloc_hider _Var3;
  char cVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Ptr PVar6;
  int local_a8;
  Token token;
  Ptr local_78;
  SimpleASTNode *local_68;
  _Alloc_hider a_Stack_60 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_40;
  undefined1 local_31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_40 = (element_type *)this;
  TokenReader::peek();
  _Var5._M_pi = extraout_RDX;
  if (local_a8 != 0x10) {
    if (local_a8 == 2) {
      TokenReader::read();
      std::__cxx11::string::operator=((string *)&token,(string *)a_Stack_60);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_60[0]._M_p != &local_50) {
        operator_delete(a_Stack_60[0]._M_p);
      }
      token.val.field_2._12_4_ = 0;
      local_68 = (SimpleASTNode *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SimpleASTNode,std::allocator<SimpleASTNode>,ASTNodeType_const&,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_60,&local_68,
                 (allocator<SimpleASTNode> *)&local_31,
                 (ASTNodeType *)(token.val.field_2._M_local_buf + 0xc),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token);
      _Var3._M_p = a_Stack_60[0]._M_p;
      pSVar2 = local_68;
      local_68 = (SimpleASTNode *)0x0;
      a_Stack_60[0]._M_p = (pointer)0x0;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_40->m_text)._M_dataplus._M_p;
      *(SimpleASTNode **)local_40 = pSVar2;
      (local_40->m_text)._M_dataplus._M_p = _Var3._M_p;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_60[0]._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_60[0]._M_p);
      }
      while (cVar4 = TokenReader::end(), _Var5._M_pi = extraout_RDX_00, cVar4 == '\0') {
        express((TokenReader *)&local_68);
        _Var3._M_p = a_Stack_60[0]._M_p;
        local_78.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
        a_Stack_60[0]._M_p = (pointer)0x0;
        local_68 = (SimpleASTNode *)0x0;
        pSVar2 = *(SimpleASTNode **)local_40;
        local_78.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(_Var3._M_p + 8) = *(int *)(_Var3._M_p + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(_Var3._M_p + 8) = *(int *)(_Var3._M_p + 8) + 1;
          }
        }
        SimpleASTNode::addChild(pSVar2,&local_78);
        if (local_78.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_p);
        }
      }
    }
    else {
      PVar6 = express((TokenReader *)&local_68);
      _Var3._M_p = a_Stack_60[0]._M_p;
      pSVar2 = local_68;
      _Var5 = PVar6.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_68 = (SimpleASTNode *)0x0;
      a_Stack_60[0]._M_p = (pointer)0x0;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_40->m_text)._M_dataplus._M_p;
      *(SimpleASTNode **)local_40 = pSVar2;
      (local_40->m_text)._M_dataplus._M_p = _Var3._M_p;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        _Var5._M_pi = extraout_RDX_01;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_60[0]._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_60[0]._M_p);
        _Var5._M_pi = extraout_RDX_02;
      }
    }
  }
  if ((size_type *)token._0_8_ != &token.val._M_string_length) {
    operator_delete((void *)token._0_8_);
    _Var5._M_pi = extraout_RDX_03;
  }
  PVar6.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  PVar6.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  return (Ptr)PVar6.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SimpleASTNode::Ptr SimpleSyntaxAnalyzer::analyze(TokenReader& tokens)
{
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    if (!token.isEmpty()) {
        if (token.type == TokenType::KEY_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create(ASTNodeType::DECLARATION, token.val);
            while (!tokens.end()) {
                SimpleASTNode::Ptr child;
                child = express(tokens);
                node->addChild(child);
            }
        } else {
            node = express(tokens);
        }
    }
    return node;
}